

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

FrameDisplay * Js::JavascriptOperators::OP_LdHandlerScope(Var argThis,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  RecyclableObject *hostObject;
  Recycler *this;
  undefined4 *puVar4;
  FrameDisplay *pDisplay;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  pDisplay = (FrameDisplay *)&NullFrameDisplay;
  if (argThis != (Var)0x0) {
    hostObject = (RecyclableObject *)
                 RootObjectBase::GetHostObject
                           (&((scriptContext->super_ScriptContextBase).globalObject)->
                             super_RootObjectBase);
    if ((hostObject == (RecyclableObject *)0x0) &&
       (hostObject = GlobalObject::GetDirectHostObject
                               ((scriptContext->super_ScriptContextBase).globalObject),
       hostObject == (RecyclableObject *)0x0)) {
      return (FrameDisplay *)&NullFrameDisplay;
    }
    local_58 = (undefined1  [8])&FrameDisplay::typeinfo;
    data.typeinfo = (type_info *)0x38;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4e91f59;
    data.filename._0_4_ = 0x1b99;
    this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00ab8666;
      *puVar4 = 0;
    }
    pDisplay = (FrameDisplay *)
               Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                         (this,0x40);
    if (pDisplay == (FrameDisplay *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00ab8666:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pDisplay->tag = true;
    pDisplay->strictMode = false;
    pDisplay->length = 7;
    pDisplay->unused = 0;
    BuildHandlerScope(argThis,hostObject,pDisplay,scriptContext);
  }
  return pDisplay;
}

Assistant:

FrameDisplay * JavascriptOperators::OP_LdHandlerScope(Var argThis, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(ScrObj_LdHandlerScope);
        // The idea here is to build a stack of nested scopes in the form of a JS array.
        //
        // The scope stack for an event handler looks like this:
        //
        // implicit "this"
        // implicit namespace parent scopes

        // Put the implicit "this"
        if (argThis != NULL)
        {
            RecyclableObject* hostObject = scriptContext->GetGlobalObject()->GetHostObject();
            if (hostObject == nullptr)
            {
                hostObject = scriptContext->GetGlobalObject()->GetDirectHostObject();
            }
            if (hostObject != nullptr)
            {
                uint16 length = 7;
                FrameDisplay *pDisplay =
                    RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(void*), FrameDisplay, length);
                BuildHandlerScope(argThis, hostObject, pDisplay, scriptContext);
                return pDisplay;
            }
        }

        return const_cast<FrameDisplay *>(&Js::NullFrameDisplay);
        JIT_HELPER_END(ScrObj_LdHandlerScope);
    }